

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O1

uint __thiscall Graphics::CompileShaders(Graphics *this)

{
  GLuint GVar1;
  GLenum GVar2;
  GLuint GVar3;
  GLuint GVar4;
  size_t sVar5;
  ChiliException *pCVar6;
  int success;
  char infoLog [512];
  wstring local_260;
  int local_23c;
  wstring local_238 [16];
  
  GVar1 = (*glad_glCreateShader)(0x8b31);
  GVar2 = (*glad_glGetError)();
  if (GVar2 != 0) {
    pCVar6 = (ChiliException *)__cxa_allocate_exception(0x50);
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)local_238,L"glCreateShader of vertex shader failed",L"");
    ChiliException::ChiliException
              (pCVar6,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xcb,local_238);
    pCVar6->_vptr_ChiliException = (_func_int **)&PTR_GetFullMessage_abi_cxx11__00163c80;
    __cxa_throw(pCVar6,&Exception::typeinfo,ChiliException::~ChiliException);
  }
  (*glad_glShaderSource)(GVar1,1,&CompileShaders::vertex_shader_src,(GLint *)0x0);
  GVar2 = (*glad_glGetError)();
  if (GVar2 != 0) {
    pCVar6 = (ChiliException *)__cxa_allocate_exception(0x50);
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)local_238,L"glShaderSource of vertex shader failed",L"");
    ChiliException::ChiliException
              (pCVar6,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xd0,local_238);
    pCVar6->_vptr_ChiliException = (_func_int **)&PTR_GetFullMessage_abi_cxx11__00163c80;
    __cxa_throw(pCVar6,&Exception::typeinfo,ChiliException::~ChiliException);
  }
  (*glad_glCompileShader)(GVar1);
  GVar2 = (*glad_glGetError)();
  if (GVar2 != 0) {
    pCVar6 = (ChiliException *)__cxa_allocate_exception(0x50);
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)local_238,L"glCompileShader of vertex shader failed",L"");
    ChiliException::ChiliException
              (pCVar6,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xd5,local_238);
    pCVar6->_vptr_ChiliException = (_func_int **)&PTR_GetFullMessage_abi_cxx11__00163c80;
    __cxa_throw(pCVar6,&Exception::typeinfo,ChiliException::~ChiliException);
  }
  (*glad_glGetShaderiv)(GVar1,0x8b81,&local_23c);
  if (local_23c == 0) {
    (*glad_glGetShaderInfoLog)(GVar1,0x200,(GLsizei *)0x0,(GLchar *)local_238);
    sVar5 = strlen((char *)local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)local_238,sVar5);
    pCVar6 = (ChiliException *)__cxa_allocate_exception(0x50);
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)&local_260,L"ERROR::SHADER::VERTEX::COMPILATION_FAILED\n",L"");
    ChiliException::ChiliException
              (pCVar6,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xde,&local_260);
    pCVar6->_vptr_ChiliException = (_func_int **)&PTR_GetFullMessage_abi_cxx11__00163c80;
    __cxa_throw(pCVar6,&Exception::typeinfo,ChiliException::~ChiliException);
  }
  GVar3 = (*glad_glCreateShader)(0x8b30);
  GVar2 = (*glad_glGetError)();
  if (GVar2 != 0) {
    pCVar6 = (ChiliException *)__cxa_allocate_exception(0x50);
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)&local_260,L"glCreateShader of fragment shader failed",L"");
    ChiliException::ChiliException
              (pCVar6,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xe5,&local_260);
    pCVar6->_vptr_ChiliException = (_func_int **)&PTR_GetFullMessage_abi_cxx11__00163c80;
    __cxa_throw(pCVar6,&Exception::typeinfo,ChiliException::~ChiliException);
  }
  (*glad_glShaderSource)(GVar3,1,&CompileShaders::fragment_shader_src,(GLint *)0x0);
  GVar2 = (*glad_glGetError)();
  if (GVar2 != 0) {
    pCVar6 = (ChiliException *)__cxa_allocate_exception(0x50);
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)&local_260,L"glShaderSource of fragment shader failed",L"");
    ChiliException::ChiliException
              (pCVar6,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xea,&local_260);
    pCVar6->_vptr_ChiliException = (_func_int **)&PTR_GetFullMessage_abi_cxx11__00163c80;
    __cxa_throw(pCVar6,&Exception::typeinfo,ChiliException::~ChiliException);
  }
  (*glad_glCompileShader)(GVar3);
  GVar2 = (*glad_glGetError)();
  if (GVar2 != 0) {
    pCVar6 = (ChiliException *)__cxa_allocate_exception(0x50);
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)&local_260,L"glCompileShader of fragment shader failed",L"");
    ChiliException::ChiliException
              (pCVar6,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xef,&local_260);
    pCVar6->_vptr_ChiliException = (_func_int **)&PTR_GetFullMessage_abi_cxx11__00163c80;
    __cxa_throw(pCVar6,&Exception::typeinfo,ChiliException::~ChiliException);
  }
  (*glad_glGetShaderiv)(GVar3,0x8b81,&local_23c);
  if (local_23c != 0) {
    GVar4 = (*glad_glCreateProgram)();
    GVar2 = (*glad_glGetError)();
    if (GVar2 != 0) {
      pCVar6 = (ChiliException *)__cxa_allocate_exception(0x50);
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)&local_260,L"glCreateProgram failed",L"");
      ChiliException::ChiliException
                (pCVar6,
                 L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
                 ,0xfc,&local_260);
      pCVar6->_vptr_ChiliException = (_func_int **)&PTR_GetFullMessage_abi_cxx11__00163c80;
      __cxa_throw(pCVar6,&Exception::typeinfo,ChiliException::~ChiliException);
    }
    (*glad_glAttachShader)(GVar4,GVar1);
    GVar2 = (*glad_glGetError)();
    if (GVar2 != 0) {
      pCVar6 = (ChiliException *)__cxa_allocate_exception(0x50);
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)&local_260,L"glAttachShader of vertex shader failed",L"");
      ChiliException::ChiliException
                (pCVar6,
                 L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
                 ,0x101,&local_260);
      pCVar6->_vptr_ChiliException = (_func_int **)&PTR_GetFullMessage_abi_cxx11__00163c80;
      __cxa_throw(pCVar6,&Exception::typeinfo,ChiliException::~ChiliException);
    }
    (*glad_glAttachShader)(GVar4,GVar3);
    GVar2 = (*glad_glGetError)();
    if (GVar2 != 0) {
      pCVar6 = (ChiliException *)__cxa_allocate_exception(0x50);
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)&local_260,L"glAttachShader of fragment shader failed",L"");
      ChiliException::ChiliException
                (pCVar6,
                 L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
                 ,0x106,&local_260);
      pCVar6->_vptr_ChiliException = (_func_int **)&PTR_GetFullMessage_abi_cxx11__00163c80;
      __cxa_throw(pCVar6,&Exception::typeinfo,ChiliException::~ChiliException);
    }
    (*glad_glLinkProgram)(GVar4);
    GVar2 = (*glad_glGetError)();
    if (GVar2 == 0) {
      (*glad_glGetProgramiv)(GVar4,0x8b82,&local_23c);
      if (local_23c == 0) {
        (*glad_glGetProgramInfoLog)(GVar4,0x200,(GLsizei *)0x0,(GLchar *)local_238);
        sVar5 = strlen((char *)local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(char *)local_238,sVar5);
        pCVar6 = (ChiliException *)__cxa_allocate_exception(0x50);
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)&local_260,L"ERROR::PROGRAM::LINK_FAILED\n",L"");
        ChiliException::ChiliException
                  (pCVar6,
                   L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
                   ,0x112,&local_260);
        pCVar6->_vptr_ChiliException = (_func_int **)&PTR_GetFullMessage_abi_cxx11__00163c80;
        __cxa_throw(pCVar6,&Exception::typeinfo,ChiliException::~ChiliException);
      }
      (*glad_glDeleteShader)(GVar1);
      GVar2 = (*glad_glGetError)();
      if (GVar2 == 0) {
        (*glad_glDeleteShader)(GVar3);
        GVar2 = (*glad_glGetError)();
        if (GVar2 == 0) {
          return GVar4;
        }
        pCVar6 = (ChiliException *)__cxa_allocate_exception(0x50);
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)&local_260,L"glDeleteShader of fragment shader failed",L"");
        ChiliException::ChiliException
                  (pCVar6,
                   L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
                   ,0x11d,&local_260);
        pCVar6->_vptr_ChiliException = (_func_int **)&PTR_GetFullMessage_abi_cxx11__00163c80;
        __cxa_throw(pCVar6,&Exception::typeinfo,ChiliException::~ChiliException);
      }
      pCVar6 = (ChiliException *)__cxa_allocate_exception(0x50);
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)&local_260,L"glDeleteShader of vertex shader failed",L"");
      ChiliException::ChiliException
                (pCVar6,
                 L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
                 ,0x118,&local_260);
      pCVar6->_vptr_ChiliException = (_func_int **)&PTR_GetFullMessage_abi_cxx11__00163c80;
      __cxa_throw(pCVar6,&Exception::typeinfo,ChiliException::~ChiliException);
    }
    pCVar6 = (ChiliException *)__cxa_allocate_exception(0x50);
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)&local_260,L"glLinkProgram failed",L"");
    ChiliException::ChiliException
              (pCVar6,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0x10b,&local_260);
    pCVar6->_vptr_ChiliException = (_func_int **)&PTR_GetFullMessage_abi_cxx11__00163c80;
    __cxa_throw(pCVar6,&Exception::typeinfo,ChiliException::~ChiliException);
  }
  (*glad_glGetShaderInfoLog)(GVar3,0x200,(GLsizei *)0x0,(GLchar *)local_238);
  sVar5 = strlen((char *)local_238);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,(char *)local_238,sVar5);
  pCVar6 = (ChiliException *)__cxa_allocate_exception(0x50);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_260,L"ERROR::SHADER::FRAGMENT::COMPILATION_FAILED\n",L"");
  ChiliException::ChiliException
            (pCVar6,
             L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
             ,0xf6,&local_260);
  pCVar6->_vptr_ChiliException = (_func_int **)&PTR_GetFullMessage_abi_cxx11__00163c80;
  __cxa_throw(pCVar6,&Exception::typeinfo,ChiliException::~ChiliException);
}

Assistant:

unsigned int Graphics::CompileShaders()
{
    static constexpr const char* vertex_shader_src = R"shader(#version 330 core
layout(location = 0) in vec2 aPos;
layout(location = 1) in vec2 aTexCoord;

out vec2 TexCoord;

void main()
{
    gl_Position = vec4(aPos.x, aPos.y, 0.0, 1.0);
    TexCoord = aTexCoord;
})shader";
    static constexpr const char* fragment_shader_src = R"shader(#version 330 core
in vec2 TexCoord;

out vec4 FragColor;

uniform sampler2D ourTexture;

void main()
{
    FragColor = texture(ourTexture, TexCoord);
})shader";

    unsigned int vertex_shader;
    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glCreateShader of vertex shader failed");
    }
    glShaderSource(vertex_shader, 1, &vertex_shader_src, NULL);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glShaderSource of vertex shader failed");
    }
    glCompileShader(vertex_shader);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glCompileShader of vertex shader failed");
    }
    int  success;
    char infoLog[512];
    glGetShaderiv(vertex_shader, GL_COMPILE_STATUS, &success);
    if (!success)
    {
        glGetShaderInfoLog(vertex_shader, 512, NULL, infoLog);
        std::cerr << infoLog;
        throw CHILI_GFX_EXCEPTION(L"ERROR::SHADER::VERTEX::COMPILATION_FAILED\n");
    }

    unsigned int fragment_shader;
    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glCreateShader of fragment shader failed");
    }
    glShaderSource(fragment_shader, 1, &fragment_shader_src, NULL);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glShaderSource of fragment shader failed");
    }
    glCompileShader(fragment_shader);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glCompileShader of fragment shader failed");
    }
    glGetShaderiv(fragment_shader, GL_COMPILE_STATUS, &success);
    if (!success)
    {
        glGetShaderInfoLog(fragment_shader, 512, NULL, infoLog);
        std::cerr << infoLog;
        throw CHILI_GFX_EXCEPTION(L"ERROR::SHADER::FRAGMENT::COMPILATION_FAILED\n");
    }

    unsigned int shader_program = glCreateProgram();
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glCreateProgram failed");
    }
    glAttachShader(shader_program, vertex_shader);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glAttachShader of vertex shader failed");
    }
    glAttachShader(shader_program, fragment_shader);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glAttachShader of fragment shader failed");
    }
    glLinkProgram(shader_program);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glLinkProgram failed");
    }
    glGetProgramiv(shader_program, GL_LINK_STATUS, &success);
    if (!success)
    {
        glGetProgramInfoLog(shader_program, 512, NULL, infoLog);
        std::cerr << infoLog;
        throw CHILI_GFX_EXCEPTION(L"ERROR::PROGRAM::LINK_FAILED\n");
    }

    glDeleteShader(vertex_shader);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glDeleteShader of vertex shader failed");
    }
    glDeleteShader(fragment_shader);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glDeleteShader of fragment shader failed");
    }

    return shader_program;
}